

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::LogBuilder::convertToColoredOutput(LogBuilder *this,string_t *logLine,Level level)

{
  int in_EDX;
  string *in_RSI;
  long in_RDI;
  char_t *resetColor;
  char *in_stack_fffffffffffffe70;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  string local_130 [32];
  string local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  char *local_20;
  string *local_10;
  
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    local_20 = "\x1b[0m";
    local_10 = in_RSI;
    if ((in_EDX == 0x10) || (in_EDX == 8)) {
      std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      std::__cxx11::string::operator=(local_10,local_40);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string(local_60);
    }
    else if (in_EDX == 0x20) {
      std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      std::__cxx11::string::operator=(local_10,local_90);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
    }
    else if (in_EDX == 4) {
      __lhs = local_f0;
      std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(__lhs,in_stack_fffffffffffffe70);
      std::__cxx11::string::operator=(local_10,local_d0);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string((string *)local_f0);
    }
    else if (in_EDX == 0x80) {
      __rhs = local_130;
      std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(in_stack_fffffffffffffe78,(char *)__rhs);
      std::__cxx11::string::operator=(local_10,local_110);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_130);
    }
    else if (in_EDX == 2) {
      std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      std::__cxx11::string::operator=(local_10,(string *)&stack0xfffffffffffffeb0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
      std::__cxx11::string::~string(local_170);
    }
  }
  return;
}

Assistant:

void LogBuilder::convertToColoredOutput(base::type::string_t* logLine, Level level) {
  if (!m_termSupportsColor) return;
  const base::type::char_t* resetColor = ELPP_LITERAL("\x1b[0m");
  if (level == Level::Error || level == Level::Fatal)
    *logLine = ELPP_LITERAL("\x1b[31m") + *logLine + resetColor;
  else if (level == Level::Warning)
    *logLine = ELPP_LITERAL("\x1b[33m") + *logLine + resetColor;
  else if (level == Level::Debug)
    *logLine = ELPP_LITERAL("\x1b[32m") + *logLine + resetColor;
  else if (level == Level::Info)
    *logLine = ELPP_LITERAL("\x1b[36m") + *logLine + resetColor;
  else if (level == Level::Trace)
    *logLine = ELPP_LITERAL("\x1b[35m") + *logLine + resetColor;
}